

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O1

bool __thiscall
flexbuffers::Verifier::VerifyVector(Verifier *this,Reference r,uint8_t *p,Type elem_type)

{
  pointer puVar1;
  undefined1 auVar2 [16];
  byte bVar3;
  bool bVar4;
  BitWidth BVar5;
  ulong uVar6;
  ulong uVar7;
  byte bVar8;
  ulong uVar9;
  long lVar10;
  uint8_t *puVar11;
  byte bVar12;
  ulong uVar13;
  uint8_t *puVar14;
  size_t len;
  ulong uVar15;
  bool bVar16;
  Reference r_00;
  Reference r_01;
  Reference r_02;
  byte local_44;
  
  uVar9 = this->depth_ + 1;
  this->depth_ = uVar9;
  uVar6 = this->num_vectors_ + 1;
  this->num_vectors_ = uVar6;
  bVar8 = 0;
  if ((uVar9 <= this->max_depth_) && (uVar6 <= this->max_vectors_)) {
    uVar13 = r._8_8_ >> 8;
    bVar12 = r.byte_width_;
    uVar9 = uVar13 & 0xff;
    uVar6 = (long)p - (long)this->buf_;
    if (uVar6 < uVar9) {
      bVar8 = 0;
    }
    else {
      uVar15 = r._8_8_ >> 0x20;
      if (this->reuse_tracker_ == (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
        local_44 = (byte)uVar6;
      }
      else {
        BVar5 = Builder::WidthB(uVar9);
        bVar8 = (char)r.type_ * '\x04' | (byte)BVar5;
        lVar10 = -(long)this->buf_ - uVar9;
        puVar1 = (this->reuse_tracker_->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (p[(long)(puVar1 + lVar10)] == bVar8) {
          bVar8 = 1;
          bVar16 = false;
        }
        else if (p[(long)(puVar1 + lVar10)] == 0) {
          p[(long)(puVar1 + lVar10)] = bVar8;
          bVar16 = true;
        }
        else {
          bVar16 = false;
          bVar8 = 0;
        }
        local_44 = bVar8;
        if (!bVar16) goto LAB_0016072e;
      }
      uVar13 = uVar13 & 0xff;
      lVar10 = -uVar13;
      if (bVar12 < 4) {
        if (bVar12 < 2) {
          uVar6 = (ulong)p[lVar10];
        }
        else {
          uVar6 = (ulong)*(ushort *)(p + lVar10);
        }
      }
      else if (bVar12 < 8) {
        uVar6 = (ulong)*(uint *)(p + lVar10);
      }
      else {
        uVar6 = *(ulong *)(p + lVar10);
      }
      bVar3 = bVar12;
      if (uVar15 == 0x19) {
        bVar3 = 1;
      }
      if (uVar15 == 5) {
        bVar3 = 1;
      }
      uVar9 = CONCAT71(0,bVar3);
      bVar8 = 0;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar9;
      if (uVar6 < SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar2,0)) {
        uVar7 = uVar6 * uVar9;
        uVar15 = this->size_;
        bVar8 = 0;
        if ((uVar7 < uVar15) && ((ulong)((long)p - (long)this->buf_) <= uVar15 - uVar7)) {
          if (elem_type == FBT_KEY) {
            lVar10 = -uVar9;
            if (bVar3 < 4) {
              if (bVar3 < 2) {
                uVar13 = (ulong)p[lVar10];
              }
              else {
                uVar13 = (ulong)*(ushort *)(p + lVar10);
              }
            }
            else if (bVar3 < 8) {
              uVar13 = (ulong)*(uint *)(p + lVar10);
            }
            else {
              uVar13 = *(ulong *)(p + lVar10);
            }
            bVar16 = uVar6 != 0;
            bVar8 = local_44;
            if (bVar16) {
              uVar15 = uVar9 | 0x400000100;
              puVar14 = p;
              if (uVar13 == 0) {
                uVar15 = 0x101;
                puVar14 = (uint8_t *)0x0;
              }
              r_00.parent_width_ = (char)uVar15;
              r_00.byte_width_ = (char)(uVar15 >> 8);
              r_00._10_2_ = (short)(uVar15 >> 0x10);
              r_00.type_ = (int)(uVar15 >> 0x20);
              r_00.data_ = puVar14;
              bVar4 = VerifyRef(this,r_00);
              if (bVar4) {
                puVar14 = p + uVar9;
                uVar15 = 1;
                do {
                  uVar7 = uVar15;
                  if (uVar6 == uVar7) goto LAB_0016071a;
                  puVar11 = (uint8_t *)0x0;
                  if (uVar7 < uVar13) {
                    puVar11 = puVar14;
                  }
                  uVar15 = 0x101;
                  if (uVar7 < uVar13) {
                    uVar15 = uVar9 | 0x400000100;
                  }
                  r_01.parent_width_ = (char)uVar15;
                  r_01.byte_width_ = (char)(uVar15 >> 8);
                  r_01._10_2_ = (short)(uVar15 >> 0x10);
                  r_01.type_ = (int)(uVar15 >> 0x20);
                  r_01.data_ = puVar11;
                  bVar16 = VerifyRef(this,r_01);
                  puVar14 = puVar14 + uVar9;
                  uVar15 = uVar7 + 1;
                } while (bVar16);
                local_44 = 0;
LAB_0016071a:
                bVar16 = uVar7 < uVar6;
                bVar8 = local_44;
              }
              else {
                bVar8 = 0;
              }
            }
            if (bVar16) goto LAB_0016072e;
          }
          else if (elem_type == FBT_NULL) {
            bVar8 = 0;
            if ((uVar15 <= uVar6) || ((uint8_t *)(uVar15 - uVar6) < p + (uVar7 - (long)this->buf_)))
            goto LAB_0016072e;
            if (bVar12 < 4) {
              if (bVar12 < 2) {
                uVar9 = (ulong)p[lVar10];
              }
              else {
                uVar9 = (ulong)*(ushort *)(p + lVar10);
              }
            }
            else if (bVar12 < 8) {
              uVar9 = (ulong)*(uint *)(p + lVar10);
            }
            else {
              uVar9 = *(ulong *)(p + lVar10);
            }
            bVar16 = uVar6 != 0;
            bVar8 = local_44;
            if (bVar16) {
              uVar15 = 0;
              puVar14 = p;
              do {
                if (uVar15 < uVar9) {
                  uVar7 = (1L << (p[uVar15 + uVar9 * uVar13] & 3)) << 8 |
                          (ulong)(p[uVar15 + uVar9 * uVar13] >> 2) << 0x20 | uVar13;
                  puVar11 = puVar14;
                }
                else {
                  uVar7 = 0x101;
                  puVar11 = (uint8_t *)0x0;
                }
                r_02.parent_width_ = (char)uVar7;
                r_02.byte_width_ = (char)(uVar7 >> 8);
                r_02._10_2_ = (short)(uVar7 >> 0x10);
                r_02.type_ = (int)(uVar7 >> 0x20);
                r_02.data_ = puVar11;
                bVar4 = VerifyRef(this,r_02);
                if (!bVar4) {
                  bVar8 = 0;
                  break;
                }
                uVar15 = uVar15 + 1;
                bVar16 = uVar15 < uVar6;
                puVar14 = puVar14 + uVar13;
              } while (uVar6 != uVar15);
            }
            if (bVar16) goto LAB_0016072e;
          }
          else if (elem_type != FBT_BOOL && 3 < (int)elem_type) {
            __assert_fail("IsInline(elem_type)",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                          ,0x71e,
                          "bool flexbuffers::Verifier::VerifyVector(Reference, const uint8_t *, Type)"
                         );
          }
          this->depth_ = this->depth_ - 1;
          bVar8 = 1;
        }
      }
    }
  }
LAB_0016072e:
  return (bool)(bVar8 & 1);
}

Assistant:

bool VerifyVector(Reference r, const uint8_t *p, Type elem_type) {
    // Any kind of nesting goes thru this function, so guard against that
    // here, both with simple nesting checks, and the reuse tracker if on.
    depth_++;
    num_vectors_++;
    if (!Check(depth_ <= max_depth_ && num_vectors_ <= max_vectors_))
      return false;
    auto size_byte_width = r.byte_width_;
    if (!VerifyBeforePointer(p, size_byte_width)) return false;
    FLEX_CHECK_VERIFIED(p - size_byte_width,
                        PackedType(Builder::WidthB(size_byte_width), r.type_));
    auto sized = Sized(p, size_byte_width);
    auto num_elems = sized.size();
    auto elem_byte_width = r.type_ == FBT_STRING || r.type_ == FBT_BLOB
                               ? uint8_t(1)
                               : r.byte_width_;
    auto max_elems = SIZE_MAX / elem_byte_width;
    if (!Check(num_elems < max_elems))
      return false;  // Protect against byte_size overflowing.
    auto byte_size = num_elems * elem_byte_width;
    if (!VerifyFromPointer(p, byte_size)) return false;
    if (elem_type == FBT_NULL) {
      // Verify type bytes after the vector.
      if (!VerifyFromPointer(p + byte_size, num_elems)) return false;
      auto v = Vector(p, size_byte_width);
      for (size_t i = 0; i < num_elems; i++)
        if (!VerifyRef(v[i])) return false;
    } else if (elem_type == FBT_KEY) {
      auto v = TypedVector(p, elem_byte_width, FBT_KEY);
      for (size_t i = 0; i < num_elems; i++)
        if (!VerifyRef(v[i])) return false;
    } else {
      FLATBUFFERS_ASSERT(IsInline(elem_type));
    }
    depth_--;
    return true;
  }